

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData256 *
cfd::core::HashUtil::Sha256D
          (ByteData256 *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  uchar *bytes_00;
  CfdException *this;
  allocator local_5d;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  undefined1 local_40 [32];
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output,0x20,
             (allocator_type *)local_40);
  bytes_00 = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ret = wally_sha256d(bytes_00,(long)(bytes->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)bytes_00,
                      output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData256::ByteData256(__return_storage_ptr__,&output);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_40._0_8_ = "cfdcore_util.cpp";
  local_40._8_4_ = 0x14e;
  local_40._16_8_ = "Sha256D";
  logger::warn<int&>((CfdSourceLocation *)local_40,"wally_sha256d NG[{}].",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_40,"sha256d calc error.",&local_5d);
  CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 HashUtil::Sha256D(const std::vector<uint8_t> &bytes) {
  std::vector<uint8_t> output(SHA256_LEN);

  // SHA256D
  int ret =
      wally_sha256d(bytes.data(), bytes.size(), output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_sha256d NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "sha256d calc error.");
  }

  return ByteData256(output);
}